

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::CheckNinjaFeatures(cmGlobalNinjaGenerator *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *local_38 [4];
  
  pcVar1 = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersionForConsolePool_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,pcVar1,local_38[0]);
  this->NinjaSupportsConsolePool = !bVar2;
  std::__cxx11::string::~string((string *)local_38);
  pcVar1 = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersionForImplicitOuts_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,pcVar1,local_38[0]);
  this->NinjaSupportsImplicitOuts = !bVar2;
  std::__cxx11::string::~string((string *)local_38);
  pcVar1 = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersionForManifestRestat_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,pcVar1,local_38[0]);
  this->NinjaSupportsManifestRestat = !bVar2;
  std::__cxx11::string::~string((string *)local_38);
  pcVar1 = (this->NinjaVersion)._M_dataplus._M_p;
  RequiredNinjaVersionForMultilineDepfile_abi_cxx11_();
  bVar2 = cmSystemTools::VersionCompare(OP_LESS,pcVar1,local_38[0]);
  this->NinjaSupportsMultilineDepfile = !bVar2;
  std::__cxx11::string::~string((string *)local_38);
  if (CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,".dyndep-",
                 (allocator<char> *)local_38);
      __cxa_atexit(std::__cxx11::string::~string,&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_);
    }
  }
  lVar4 = std::__cxx11::string::find((string *)&this->NinjaVersion,0x54d330);
  if (lVar4 != -1) {
    cmSystemTools::StringToULong
              ((this->NinjaVersion)._M_dataplus._M_p +
               CheckNinjaFeatures()::k_DYNDEP__abi_cxx11_._M_string_length + lVar4,
               &this->NinjaSupportsDyndeps);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CheckNinjaFeatures()
{
  this->NinjaSupportsConsolePool = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForConsolePool().c_str());
  this->NinjaSupportsImplicitOuts = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    cmGlobalNinjaGenerator::RequiredNinjaVersionForImplicitOuts().c_str());
  this->NinjaSupportsManifestRestat = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForManifestRestat().c_str());
  this->NinjaSupportsMultilineDepfile = !cmSystemTools::VersionCompare(
    cmSystemTools::OP_LESS, this->NinjaVersion.c_str(),
    RequiredNinjaVersionForMultilineDepfile().c_str());
  {
    // Our ninja branch adds ".dyndep-#" to its version number,
    // where '#' is a feature-specific version number.  Extract it.
    static std::string const k_DYNDEP_ = ".dyndep-";
    std::string::size_type pos = this->NinjaVersion.find(k_DYNDEP_);
    if (pos != std::string::npos) {
      const char* fv = this->NinjaVersion.c_str() + pos + k_DYNDEP_.size();
      cmSystemTools::StringToULong(fv, &this->NinjaSupportsDyndeps);
    }
  }
}